

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogParser.cpp
# Opt level: O1

void __thiscall xe::TestLogParser::parse(TestLogParser *this,deUint8 *bytes,size_t numBytes)

{
  deInt32 *pdVar1;
  TestCaseResultPtr *pTVar2;
  pointer puVar3;
  SharedPtrStateBase *pSVar4;
  int iVar5;
  deBool dVar6;
  int numBytes_00;
  TestStatusCode statusCode;
  char *__s;
  pointer puVar7;
  char *pcVar8;
  runtime_error *prVar9;
  TestCaseResultData *pTVar10;
  undefined8 uVar11;
  TestCaseResultData *local_80;
  SharedPtrStateBase *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  SessionInfo *local_50;
  _Alloc_hider local_48;
  SessionInfo *local_40;
  undefined8 local_38;
  
  ContainerFormatParser::feed(&this->m_containerParser,bytes,numBytes);
  pTVar2 = &this->m_currentCaseData;
  local_38 = &(this->m_sessionInfo).releaseId;
  local_40 = (SessionInfo *)&(this->m_sessionInfo).targetName;
  local_48._M_p = (pointer)&(this->m_sessionInfo).candyTargetName;
  local_50 = (SessionInfo *)&(this->m_sessionInfo).configName;
  local_60._8_8_ = &(this->m_sessionInfo).resultName;
  local_60._M_allocated_capacity = (size_type)&(this->m_sessionInfo).timestamp;
  do {
    switch((this->m_containerParser).m_element) {
    case CONTAINERELEMENT_INCOMPLETE:
      return;
    case CONTAINERELEMENT_END_OF_STRING:
      pTVar10 = pTVar2->m_ptr;
      if (pTVar10 != (TestCaseResultData *)0x0) {
        statusCode = TESTSTATUSCODE_TERMINATED;
        pcVar8 = "Unexpected end of string";
LAB_001108b8:
        TestCaseResultData::setTestResult(pTVar10,statusCode,pcVar8);
        (*this->m_handler->_vptr_TestLogHandler[5])(this->m_handler,pTVar2);
      }
      goto LAB_001108ca;
    case CONTAINERELEMENT_BEGIN_SESSION:
      if (this->m_inSession == true) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_80 = (TestCaseResultData *)&stack0xffffffffffffff90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"Unexpected #beginSession","");
        std::runtime_error::runtime_error(prVar9,(string *)&local_80);
        *(undefined ***)prVar9 = &PTR__runtime_error_00127038;
        __cxa_throw(prVar9,&Error::typeinfo,std::runtime_error::~runtime_error);
      }
      (*this->m_handler->_vptr_TestLogHandler[2])(this->m_handler,&this->m_sessionInfo);
      this->m_inSession = true;
      break;
    case CONTAINERELEMENT_END_SESSION:
      if (this->m_inSession == false) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_80 = (TestCaseResultData *)&stack0xffffffffffffff90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"Unexpected #endSession","");
        std::runtime_error::runtime_error(prVar9,(string *)&local_80);
        *(undefined ***)prVar9 = &PTR__runtime_error_00127038;
        __cxa_throw(prVar9,&Error::typeinfo,std::runtime_error::~runtime_error);
      }
      this->m_inSession = false;
      break;
    case CONTAINERELEMENT_SESSION_INFO:
      if (this->m_inSession == true) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_80 = (TestCaseResultData *)&stack0xffffffffffffff90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"Unexpected #sessionInfo","");
        std::runtime_error::runtime_error(prVar9,(string *)&local_80);
        *(undefined ***)prVar9 = &PTR__runtime_error_00127038;
        __cxa_throw(prVar9,&Error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar8 = ContainerFormatParser::getSessionInfoAttribute(&this->m_containerParser);
      __s = ContainerFormatParser::getSessionInfoValue(&this->m_containerParser);
      dVar6 = deStringEqual(pcVar8,"releaseName");
      if (dVar6 == 0) {
        dVar6 = deStringEqual(pcVar8,"releaseId");
        if (dVar6 == 0) {
          dVar6 = deStringEqual(pcVar8,"targetName");
          if (dVar6 == 0) {
            dVar6 = deStringEqual(pcVar8,"candyTargetName");
            if (dVar6 == 0) {
              dVar6 = deStringEqual(pcVar8,"configName");
              if (dVar6 == 0) {
                dVar6 = deStringEqual(pcVar8,"resultName");
                uVar11 = local_60._8_8_;
                if ((dVar6 != 0) ||
                   (dVar6 = deStringEqual(pcVar8,"timestamp"),
                   uVar11 = local_60._M_allocated_capacity, dVar6 != 0)) {
                  std::__cxx11::string::operator=((string *)uVar11,__s);
                }
                break;
              }
              pcVar8 = (char *)(this->m_sessionInfo).configName._M_string_length;
              strlen(__s);
              uVar11 = local_50;
            }
            else {
              pcVar8 = (char *)(this->m_sessionInfo).candyTargetName._M_string_length;
              strlen(__s);
              uVar11 = local_48._M_p;
            }
          }
          else {
            pcVar8 = (char *)(this->m_sessionInfo).targetName._M_string_length;
            strlen(__s);
            uVar11 = local_40;
          }
        }
        else {
          pcVar8 = (char *)(this->m_sessionInfo).releaseId._M_string_length;
          strlen(__s);
          uVar11 = local_38;
        }
      }
      else {
        pcVar8 = (char *)(this->m_sessionInfo).releaseName._M_string_length;
        strlen(__s);
        uVar11 = &this->m_sessionInfo;
      }
      std::__cxx11::string::_M_replace(uVar11,0,pcVar8,(ulong)__s);
      break;
    case CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT:
      if (this->m_inSession == false) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_80 = (TestCaseResultData *)&stack0xffffffffffffff90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"Unexpected #beginTestCaseResult","");
        std::runtime_error::runtime_error(prVar9,(string *)&local_80);
        *(undefined ***)prVar9 = &PTR__runtime_error_00127038;
        __cxa_throw(prVar9,&Error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar8 = ContainerFormatParser::getTestCasePath(&this->m_containerParser);
      (*this->m_handler->_vptr_TestLogHandler[3])(&local_80,this->m_handler,pcVar8);
      pSVar4 = (this->m_currentCaseData).m_state;
      if (pSVar4 != local_78) {
        if (pSVar4 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &pSVar4->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            (this->m_currentCaseData).m_ptr = (TestCaseResultData *)0x0;
            (*((this->m_currentCaseData).m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &((this->m_currentCaseData).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            pSVar4 = (this->m_currentCaseData).m_state;
            if (pSVar4 != (SharedPtrStateBase *)0x0) {
              (*pSVar4->_vptr_SharedPtrStateBase[1])();
            }
            (this->m_currentCaseData).m_state = (SharedPtrStateBase *)0x0;
          }
        }
        (this->m_currentCaseData).m_ptr = local_80;
        (this->m_currentCaseData).m_state = local_78;
        if (local_78 != (SharedPtrStateBase *)0x0) {
          LOCK();
          local_78->strongRefCount = local_78->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((this->m_currentCaseData).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
      }
      if (local_78 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_78->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_80 = (TestCaseResultData *)0x0;
          (*local_78->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &local_78->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_78 != (SharedPtrStateBase *)0x0) {
            (*local_78->_vptr_SharedPtrStateBase[1])();
          }
          local_78 = (SharedPtrStateBase *)0x0;
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&((this->m_currentCaseData).m_ptr)->m_data,0);
      TestCaseResultData::setTestResult
                ((this->m_currentCaseData).m_ptr,TESTSTATUSCODE_RUNNING,"Running");
LAB_00110845:
      (*this->m_handler->_vptr_TestLogHandler[4])(this->m_handler,pTVar2);
      break;
    case CONTAINERELEMENT_END_TEST_CASE_RESULT:
      pTVar10 = pTVar2->m_ptr;
      if (pTVar10 != (TestCaseResultData *)0x0) {
        statusCode = TESTSTATUSCODE_LAST;
        pcVar8 = "";
        goto LAB_001108b8;
      }
      goto LAB_001108ca;
    case CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT:
      if (pTVar2->m_ptr != (TestCaseResultData *)0x0) {
        pcVar8 = ContainerFormatParser::getTerminateReason(&this->m_containerParser);
        statusCode = getTestStatusCode(pcVar8);
        pTVar10 = (this->m_currentCaseData).m_ptr;
        goto LAB_001108b8;
      }
LAB_001108ca:
      pSVar4 = (this->m_currentCaseData).m_state;
      if (pSVar4 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSVar4->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (this->m_currentCaseData).m_ptr = (TestCaseResultData *)0x0;
          (*((this->m_currentCaseData).m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &((this->m_currentCaseData).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar4 = (this->m_currentCaseData).m_state;
          if (pSVar4 != (SharedPtrStateBase *)0x0) {
            (*pSVar4->_vptr_SharedPtrStateBase[1])();
          }
          (this->m_currentCaseData).m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pTVar2->m_ptr = (TestCaseResultData *)0x0;
      (this->m_currentCaseData).m_state = (SharedPtrStateBase *)0x0;
      break;
    case CONTAINERELEMENT_TEST_LOG_DATA:
      pTVar10 = pTVar2->m_ptr;
      if (pTVar10 != (TestCaseResultData *)0x0) {
        iVar5 = (int)(pTVar10->m_data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
                (int)(pTVar10->m_data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
        numBytes_00 = ContainerFormatParser::getDataSize(&this->m_containerParser);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&((this->m_currentCaseData).m_ptr)->m_data,(long)(numBytes_00 + iVar5));
        pTVar10 = (this->m_currentCaseData).m_ptr;
        puVar3 = (pTVar10->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar7 = (pointer)0x0;
        if (puVar3 != (pTVar10->m_data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          puVar7 = puVar3;
        }
        ContainerFormatParser::getData(&this->m_containerParser,puVar7 + iVar5,numBytes_00,0);
        goto LAB_00110845;
      }
      break;
    default:
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_80 = (TestCaseResultData *)&stack0xffffffffffffff90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Unknown container element","");
      std::runtime_error::runtime_error(prVar9,(string *)&local_80);
      *(undefined ***)prVar9 = &PTR__runtime_error_00127060;
      __cxa_throw(prVar9,&ContainerParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    ContainerFormatParser::advance(&this->m_containerParser);
  } while( true );
}

Assistant:

void TestLogParser::parse (const deUint8* bytes, size_t numBytes)
{
	m_containerParser.feed(bytes, numBytes);

	for (;;)
	{
		ContainerElement element = m_containerParser.getElement();

		if (element == CONTAINERELEMENT_INCOMPLETE)
			break;

		switch (element)
		{
			case CONTAINERELEMENT_BEGIN_SESSION:
			{
				if (m_inSession)
					throw Error("Unexpected #beginSession");

				m_handler->setSessionInfo(m_sessionInfo);
				m_inSession = true;
				break;
			}

			case CONTAINERELEMENT_END_SESSION:
			{
				if (!m_inSession)
					throw Error("Unexpected #endSession");

				m_inSession = false;
				break;
			}

			case CONTAINERELEMENT_SESSION_INFO:
			{
				if (m_inSession)
					throw Error("Unexpected #sessionInfo");

				const char*		attribute	= m_containerParser.getSessionInfoAttribute();
				const char*		value		= m_containerParser.getSessionInfoValue();

				if (deStringEqual(attribute, "releaseName"))
					m_sessionInfo.releaseName = value;
				else if (deStringEqual(attribute, "releaseId"))
					m_sessionInfo.releaseId = value;
				else if (deStringEqual(attribute, "targetName"))
					m_sessionInfo.targetName = value;
				else if (deStringEqual(attribute, "candyTargetName"))
					m_sessionInfo.candyTargetName = value;
				else if (deStringEqual(attribute, "configName"))
					m_sessionInfo.configName = value;
				else if (deStringEqual(attribute, "resultName"))
					m_sessionInfo.resultName = value;
				else if (deStringEqual(attribute, "timestamp"))
					m_sessionInfo.timestamp = value;

				// \todo [2012-06-09 pyry] What to do with unknown/duplicate attributes? Currently just ignored.
				break;
			}

			case CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT:
			{
				if (!m_inSession)
					throw Error("Unexpected #beginTestCaseResult");

				const char* casePath = m_containerParser.getTestCasePath();
				m_currentCaseData = m_handler->startTestCaseResult(casePath);

				// Clear and set to running state.
				m_currentCaseData->setDataSize(0);
				m_currentCaseData->setTestResult(TESTSTATUSCODE_RUNNING, "Running");

				m_handler->testCaseResultUpdated(m_currentCaseData);
				break;
			}

			case CONTAINERELEMENT_END_TEST_CASE_RESULT:
				if (m_currentCaseData)
				{
					// \todo [2012-06-16 pyry] Parse status code already here?
					m_currentCaseData->setTestResult(TESTSTATUSCODE_LAST, "");
					m_handler->testCaseResultComplete(m_currentCaseData);
				}
				m_currentCaseData.clear();
				break;

			case CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT:
				if (m_currentCaseData)
				{
					TestStatusCode	statusCode	= TESTSTATUSCODE_CRASH;
					const char*		reason		= m_containerParser.getTerminateReason();
					try
					{
						statusCode = getTestStatusCode(reason);
					}
					catch (const xe::ParseError&)
					{
						// Could not map status code.
					}
					m_currentCaseData->setTestResult(statusCode, reason);
					m_handler->testCaseResultComplete(m_currentCaseData);
				}
				m_currentCaseData.clear();
				break;

			case CONTAINERELEMENT_END_OF_STRING:
				if (m_currentCaseData)
				{
					// Terminate current case.
					m_currentCaseData->setTestResult(TESTSTATUSCODE_TERMINATED, "Unexpected end of string");
					m_handler->testCaseResultComplete(m_currentCaseData);
				}
				m_currentCaseData.clear();
				break;

			case CONTAINERELEMENT_TEST_LOG_DATA:
				if (m_currentCaseData)
				{
					int offset			= m_currentCaseData->getDataSize();
					int	numDataBytes	= m_containerParser.getDataSize();

					m_currentCaseData->setDataSize(offset+numDataBytes);
					m_containerParser.getData(m_currentCaseData->getData()+offset, numDataBytes, 0);

					m_handler->testCaseResultUpdated(m_currentCaseData);
				}
				break;

			default:
				throw ContainerParseError("Unknown container element");
		}

		m_containerParser.advance();
	}
}